

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

bool testing::internal::ParseInt32(Message *src_text,char *str,Int32 *value)

{
  char *pcVar1;
  Message *this;
  Message *this_00;
  String *this_01;
  int *in_RDX;
  char *in_RSI;
  Message msg_1;
  Int32 result;
  Message msg;
  long long_value;
  char *end;
  String *in_stack_ffffffffffffff20;
  Message *in_stack_ffffffffffffff28;
  Message *in_stack_ffffffffffffff30;
  Message *in_stack_ffffffffffffff50;
  String local_78;
  int local_5c;
  String local_58 [2];
  long local_30;
  char *local_28;
  int *local_20;
  byte local_1;
  
  local_28 = (char *)0x0;
  local_20 = in_RDX;
  local_30 = strtol(in_RSI,&local_28,10);
  if (*local_28 == '\0') {
    local_5c = (int)local_30;
    if (((local_30 == 0x7fffffffffffffff) || (local_30 == -0x8000000000000000)) ||
       (local_5c != local_30)) {
      Message::Message(in_stack_ffffffffffffff50);
      Message::operator<<(in_stack_ffffffffffffff30,(char (*) [10])in_stack_ffffffffffffff28);
      Message::operator<<(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      this = Message::operator<<(in_stack_ffffffffffffff30,(char (*) [50])in_stack_ffffffffffffff28)
      ;
      this_00 = Message::operator<<(this,(char (*) [12])in_stack_ffffffffffffff28);
      this_01 = (String *)Message::operator<<(this,(char **)this_00);
      Message::operator<<(this,(char (*) [20])this_00);
      Message::GetString(this_00);
      pcVar1 = String::c_str(&local_78);
      printf("%s",pcVar1);
      String::~String(this_01);
      fflush(_stdout);
      local_1 = 0;
      Message::~Message((Message *)0x24c9a5);
    }
    else {
      *local_20 = local_5c;
      local_1 = 1;
    }
  }
  else {
    Message::Message(in_stack_ffffffffffffff50);
    Message::operator<<(in_stack_ffffffffffffff30,(char (*) [10])in_stack_ffffffffffffff28);
    Message::operator<<(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    Message::operator<<(in_stack_ffffffffffffff30,(char (*) [50])in_stack_ffffffffffffff28);
    Message::operator<<(in_stack_ffffffffffffff30,(char (*) [13])in_stack_ffffffffffffff28);
    Message::operator<<(in_stack_ffffffffffffff30,(char **)in_stack_ffffffffffffff28);
    Message::operator<<(in_stack_ffffffffffffff30,(char (*) [4])in_stack_ffffffffffffff28);
    Message::GetString(in_stack_ffffffffffffff28);
    pcVar1 = String::c_str(local_58);
    printf("%s",pcVar1);
    String::~String(in_stack_ffffffffffffff20);
    fflush(_stdout);
    local_1 = 0;
    Message::~Message((Message *)0x24c803);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool ParseInt32(const Message& src_text, const char* str, Int32* value) {
  // Parses the environment variable as a decimal integer.
  char* end = NULL;
  const long long_value = strtol(str, &end, 10);  // NOLINT

  // Has strtol() consumed all characters in the string?
  if (*end != '\0') {
    // No - an invalid character was encountered.
    Message msg;
    msg << "WARNING: " << src_text
        << " is expected to be a 32-bit integer, but actually"
        << " has value \"" << str << "\".\n";
    printf("%s", msg.GetString().c_str());
    fflush(stdout);
    return false;
  }

  // Is the parsed value in the range of an Int32?
  const Int32 result = static_cast<Int32>(long_value);
  if (long_value == LONG_MAX || long_value == LONG_MIN ||
      // The parsed value overflows as a long.  (strtol() returns
      // LONG_MAX or LONG_MIN when the input overflows.)
      result != long_value
      // The parsed value overflows as an Int32.
      ) {
    Message msg;
    msg << "WARNING: " << src_text
        << " is expected to be a 32-bit integer, but actually"
        << " has value " << str << ", which overflows.\n";
    printf("%s", msg.GetString().c_str());
    fflush(stdout);
    return false;
  }

  *value = result;
  return true;
}